

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

void google::protobuf::swap(FieldOptions_EditionDefault *a,FieldOptions_EditionDefault *b)

{
  uint32_t uVar1;
  int iVar2;
  void *pvVar3;
  intptr_t iVar4;
  Nonnull<const_char_*> pcVar5;
  ulong uVar6;
  ulong uVar7;
  void *v2;
  void *pvVar8;
  
  if (b == a) {
    return;
  }
  uVar6 = (a->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    uVar6 = *(ulong *)(uVar6 & 0xfffffffffffffffe);
  }
  uVar7 = (b->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    uVar7 = *(ulong *)(uVar7 & 0xfffffffffffffffe);
  }
  if (uVar6 == uVar7) {
    pvVar8 = (void *)(a->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pvVar8 & 1) != 0) {
      pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
    }
    pvVar3 = (void *)(b->super_Message).super_MessageLite._internal_metadata_.ptr_;
    v2 = pvVar3;
    if (((ulong)pvVar3 & 1) != 0) {
      v2 = *(void **)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    if (pvVar8 == v2) {
      pcVar5 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                         (pvVar8,v2,"arena == other->GetArena()");
    }
    if (pcVar5 != (Nonnull<const_char_*>)0x0) {
      FieldOptions_EditionDefault::InternalSwap();
    }
    iVar4 = (a->super_Message).super_MessageLite._internal_metadata_.ptr_;
    (a->super_Message).super_MessageLite._internal_metadata_.ptr_ = (intptr_t)pvVar3;
    (b->super_Message).super_MessageLite._internal_metadata_.ptr_ = iVar4;
    uVar1 = (a->field_0)._impl_._has_bits_.has_bits_[0];
    (a->field_0)._impl_._has_bits_.has_bits_[0] = (b->field_0)._impl_._has_bits_.has_bits_[0];
    (b->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar8 = (b->field_0)._impl_.value_.tagged_ptr_.ptr_;
    (b->field_0)._impl_.value_.tagged_ptr_.ptr_ = (a->field_0)._impl_.value_.tagged_ptr_.ptr_;
    (a->field_0)._impl_.value_.tagged_ptr_.ptr_ = pvVar8;
    iVar2 = (a->field_0)._impl_.edition_;
    (a->field_0)._impl_.edition_ = (b->field_0)._impl_.edition_;
    (b->field_0)._impl_.edition_ = iVar2;
    return;
  }
  internal::GenericSwap(&a->super_Message,&b->super_Message);
  return;
}

Assistant:

friend void swap(FieldOptions_EditionDefault& a, FieldOptions_EditionDefault& b) { a.Swap(&b); }